

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O2

void __thiscall
cmCTestTestHandler::GenerateRegressionImages(cmCTestTestHandler *this,cmXMLWriter *xml,string *dart)

{
  cmCTest *this_00;
  cmCTestTestHandler *pcVar1;
  _Alloc_hider _Var2;
  bool bVar3;
  unsigned_long length;
  uchar *input;
  uchar *output;
  size_t sVar4;
  ostream *poVar5;
  ulong uVar6;
  allocator<char> local_989;
  string k2;
  string cxml;
  string local_940;
  cmXMLWriter *local_920;
  cmCTestTestHandler *local_918;
  string local_910;
  string v2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8b0;
  ifstream ifs;
  RegularExpression measurementfile;
  ostringstream ostr;
  RegularExpression fourattributes;
  RegularExpression cdatastart;
  RegularExpression threeattributes;
  RegularExpression twoattributes;
  RegularExpression cdataend;
  
  cmsys::RegularExpression::RegularExpression
            (&twoattributes,
             "<DartMeasurement[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*>([^<]*)</DartMeasurement>"
            );
  cmsys::RegularExpression::RegularExpression
            (&threeattributes,
             "<DartMeasurement[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*>([^<]*)</DartMeasurement>"
            );
  cmsys::RegularExpression::RegularExpression
            (&fourattributes,
             "<DartMeasurement[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*>([^<]*)</DartMeasurement>"
            );
  cmsys::RegularExpression::RegularExpression
            (&cdatastart,
             "<DartMeasurement[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*>[ \t\r\n]*<!\\[CDATA\\["
            );
  cmsys::RegularExpression::RegularExpression(&cdataend,"]]>[ \t\r\n]*</DartMeasurement>");
  cmsys::RegularExpression::RegularExpression
            (&measurementfile,
             "<DartMeasurementFile[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*>([^<]*)</DartMeasurementFile>"
            );
  local_918 = this;
  std::__cxx11::string::string((string *)&cxml,(string *)dart);
  local_920 = xml;
  do {
    while( true ) {
      bVar3 = cmsys::RegularExpression::find(&twoattributes,cxml._M_dataplus._M_p);
      if (!bVar3) break;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ifs,"NamedMeasurement",(allocator<char> *)&ostr);
      cmXMLWriter::StartElement(xml,(string *)&ifs);
      std::__cxx11::string::~string((string *)&ifs);
      cmsys::RegularExpressionMatch::match_abi_cxx11_((string *)&ifs,&twoattributes.regmatch,1);
      _Var2._M_p = _ifs;
      cmsys::RegularExpressionMatch::match_abi_cxx11_((string *)&ostr,&twoattributes.regmatch,2);
      cmXMLWriter::Attribute<std::__cxx11::string>(xml,_Var2._M_p,(string *)&ostr);
      std::__cxx11::string::~string((string *)&ostr);
      std::__cxx11::string::~string((string *)&ifs);
      cmsys::RegularExpressionMatch::match_abi_cxx11_((string *)&ifs,&twoattributes.regmatch,3);
      _Var2._M_p = _ifs;
      cmsys::RegularExpressionMatch::match_abi_cxx11_((string *)&ostr,&twoattributes.regmatch,4);
      cmXMLWriter::Attribute<std::__cxx11::string>(xml,_Var2._M_p,(string *)&ostr);
      std::__cxx11::string::~string((string *)&ostr);
      std::__cxx11::string::~string((string *)&ifs);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ifs,"Value",(allocator<char> *)&local_940);
      cmsys::RegularExpressionMatch::match_abi_cxx11_((string *)&ostr,&twoattributes.regmatch,5);
      cmXMLWriter::Element<std::__cxx11::string>(xml,(string *)&ifs,(string *)&ostr);
      std::__cxx11::string::~string((string *)&ostr);
      std::__cxx11::string::~string((string *)&ifs);
      cmXMLWriter::EndElement(xml);
      uVar6 = (long)twoattributes.regmatch.startp[0] - (long)twoattributes.regmatch.searchstring;
LAB_0018c4b6:
      std::__cxx11::string::erase((ulong)&cxml,uVar6);
    }
    bVar3 = cmsys::RegularExpression::find(&threeattributes,cxml._M_dataplus._M_p);
    if (bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ifs,"NamedMeasurement",(allocator<char> *)&ostr);
      cmXMLWriter::StartElement(xml,(string *)&ifs);
      std::__cxx11::string::~string((string *)&ifs);
      cmsys::RegularExpressionMatch::match_abi_cxx11_((string *)&ifs,&threeattributes.regmatch,1);
      _Var2._M_p = _ifs;
      cmsys::RegularExpressionMatch::match_abi_cxx11_((string *)&ostr,&threeattributes.regmatch,2);
      cmXMLWriter::Attribute<std::__cxx11::string>(xml,_Var2._M_p,(string *)&ostr);
      std::__cxx11::string::~string((string *)&ostr);
      std::__cxx11::string::~string((string *)&ifs);
      cmsys::RegularExpressionMatch::match_abi_cxx11_((string *)&ifs,&threeattributes.regmatch,3);
      _Var2._M_p = _ifs;
      cmsys::RegularExpressionMatch::match_abi_cxx11_((string *)&ostr,&threeattributes.regmatch,4);
      cmXMLWriter::Attribute<std::__cxx11::string>(xml,_Var2._M_p,(string *)&ostr);
      std::__cxx11::string::~string((string *)&ostr);
      std::__cxx11::string::~string((string *)&ifs);
      cmsys::RegularExpressionMatch::match_abi_cxx11_((string *)&ifs,&threeattributes.regmatch,5);
      _Var2._M_p = _ifs;
      cmsys::RegularExpressionMatch::match_abi_cxx11_((string *)&ostr,&threeattributes.regmatch,6);
      cmXMLWriter::Attribute<std::__cxx11::string>(xml,_Var2._M_p,(string *)&ostr);
      std::__cxx11::string::~string((string *)&ostr);
      std::__cxx11::string::~string((string *)&ifs);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ifs,"Value",(allocator<char> *)&local_940);
      cmsys::RegularExpressionMatch::match_abi_cxx11_((string *)&ostr,&twoattributes.regmatch,7);
      cmXMLWriter::Element<std::__cxx11::string>(xml,(string *)&ifs,(string *)&ostr);
      std::__cxx11::string::~string((string *)&ostr);
      std::__cxx11::string::~string((string *)&ifs);
      cmXMLWriter::EndElement(xml);
      uVar6 = (long)threeattributes.regmatch.startp[0] - (long)threeattributes.regmatch.searchstring
      ;
      goto LAB_0018c4b6;
    }
    bVar3 = cmsys::RegularExpression::find(&fourattributes,cxml._M_dataplus._M_p);
    if (bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ifs,"NamedMeasurement",(allocator<char> *)&ostr);
      cmXMLWriter::StartElement(xml,(string *)&ifs);
      std::__cxx11::string::~string((string *)&ifs);
      cmsys::RegularExpressionMatch::match_abi_cxx11_((string *)&ifs,&fourattributes.regmatch,1);
      _Var2._M_p = _ifs;
      cmsys::RegularExpressionMatch::match_abi_cxx11_((string *)&ostr,&fourattributes.regmatch,2);
      cmXMLWriter::Attribute<std::__cxx11::string>(xml,_Var2._M_p,(string *)&ostr);
      std::__cxx11::string::~string((string *)&ostr);
      std::__cxx11::string::~string((string *)&ifs);
      cmsys::RegularExpressionMatch::match_abi_cxx11_((string *)&ifs,&fourattributes.regmatch,3);
      _Var2._M_p = _ifs;
      cmsys::RegularExpressionMatch::match_abi_cxx11_((string *)&ostr,&fourattributes.regmatch,4);
      cmXMLWriter::Attribute<std::__cxx11::string>(xml,_Var2._M_p,(string *)&ostr);
      std::__cxx11::string::~string((string *)&ostr);
      std::__cxx11::string::~string((string *)&ifs);
      cmsys::RegularExpressionMatch::match_abi_cxx11_((string *)&ifs,&fourattributes.regmatch,5);
      _Var2._M_p = _ifs;
      cmsys::RegularExpressionMatch::match_abi_cxx11_((string *)&ostr,&fourattributes.regmatch,6);
      cmXMLWriter::Attribute<std::__cxx11::string>(xml,_Var2._M_p,(string *)&ostr);
      std::__cxx11::string::~string((string *)&ostr);
      std::__cxx11::string::~string((string *)&ifs);
      cmsys::RegularExpressionMatch::match_abi_cxx11_((string *)&ifs,&fourattributes.regmatch,7);
      _Var2._M_p = _ifs;
      cmsys::RegularExpressionMatch::match_abi_cxx11_((string *)&ostr,&fourattributes.regmatch,8);
      cmXMLWriter::Attribute<std::__cxx11::string>(xml,_Var2._M_p,(string *)&ostr);
      std::__cxx11::string::~string((string *)&ostr);
      std::__cxx11::string::~string((string *)&ifs);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ifs,"Value",(allocator<char> *)&local_940);
      cmsys::RegularExpressionMatch::match_abi_cxx11_((string *)&ostr,&twoattributes.regmatch,9);
      cmXMLWriter::Element<std::__cxx11::string>(xml,(string *)&ifs,(string *)&ostr);
      std::__cxx11::string::~string((string *)&ostr);
      std::__cxx11::string::~string((string *)&ifs);
      cmXMLWriter::EndElement(xml);
      uVar6 = (long)fourattributes.regmatch.startp[0] - (long)fourattributes.regmatch.searchstring;
      goto LAB_0018c4b6;
    }
    bVar3 = cmsys::RegularExpression::find(&cdatastart,cxml._M_dataplus._M_p);
    if ((bVar3) && (bVar3 = cmsys::RegularExpression::find(&cdataend,cxml._M_dataplus._M_p), bVar3))
    {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ifs,"NamedMeasurement",(allocator<char> *)&ostr);
      cmXMLWriter::StartElement(xml,(string *)&ifs);
      std::__cxx11::string::~string((string *)&ifs);
      cmsys::RegularExpressionMatch::match_abi_cxx11_((string *)&ifs,&cdatastart.regmatch,1);
      _Var2._M_p = _ifs;
      cmsys::RegularExpressionMatch::match_abi_cxx11_((string *)&ostr,&cdatastart.regmatch,2);
      cmXMLWriter::Attribute<std::__cxx11::string>(xml,_Var2._M_p,(string *)&ostr);
      std::__cxx11::string::~string((string *)&ostr);
      std::__cxx11::string::~string((string *)&ifs);
      cmsys::RegularExpressionMatch::match_abi_cxx11_((string *)&ifs,&cdatastart.regmatch,3);
      _Var2._M_p = _ifs;
      cmsys::RegularExpressionMatch::match_abi_cxx11_((string *)&ostr,&cdatastart.regmatch,4);
      cmXMLWriter::Attribute<std::__cxx11::string>(xml,_Var2._M_p,(string *)&ostr);
      std::__cxx11::string::~string((string *)&ostr);
      std::__cxx11::string::~string((string *)&ifs);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ifs,"Value",(allocator<char> *)&ostr);
      cmXMLWriter::StartElement(xml,(string *)&ifs);
      std::__cxx11::string::~string((string *)&ifs);
      std::__cxx11::string::substr((ulong)&ifs,(ulong)&cxml);
      cmXMLWriter::CData(xml,(string *)&ifs);
      std::__cxx11::string::~string((string *)&ifs);
      cmXMLWriter::EndElement(xml);
      cmXMLWriter::EndElement(xml);
      uVar6 = (long)cdatastart.regmatch.startp[0] - (long)cdatastart.regmatch.searchstring;
      goto LAB_0018c4b6;
    }
    bVar3 = cmsys::RegularExpression::find(&measurementfile,cxml._M_dataplus._M_p);
    if (!bVar3) {
      std::__cxx11::string::~string((string *)&cxml);
      cmsys::RegularExpression::~RegularExpression(&measurementfile);
      cmsys::RegularExpression::~RegularExpression(&cdataend);
      cmsys::RegularExpression::~RegularExpression(&cdatastart);
      cmsys::RegularExpression::~RegularExpression(&fourattributes);
      cmsys::RegularExpression::~RegularExpression(&threeattributes);
      cmsys::RegularExpression::~RegularExpression(&twoattributes);
      return;
    }
    cmsys::RegularExpressionMatch::match_abi_cxx11_((string *)&ifs,&measurementfile.regmatch,5);
    cmCTest::CleanString(&local_940,(string *)&ifs);
    std::__cxx11::string::~string((string *)&ifs);
    bVar3 = cmsys::SystemTools::FileExists(&local_940);
    if (bVar3) {
      length = cmsys::SystemTools::FileLength(&local_940);
      if (length == 0) {
        cmsys::RegularExpressionMatch::match_abi_cxx11_((string *)&ifs,&measurementfile.regmatch,1);
        cmsys::RegularExpressionMatch::match_abi_cxx11_((string *)&ostr,&measurementfile.regmatch,2)
        ;
        cmsys::RegularExpressionMatch::match_abi_cxx11_(&k2,&measurementfile.regmatch,3);
        cmsys::RegularExpressionMatch::match_abi_cxx11_(&v2,&measurementfile.regmatch,4);
        cmsys::SystemTools::LowerCase(&local_910,(string *)&ifs);
        bVar3 = std::operator==(&local_910,"type");
        std::__cxx11::string::~string((string *)&local_910);
        if (bVar3) {
          std::__cxx11::string::assign((char *)&ostr);
        }
        cmsys::SystemTools::LowerCase(&local_910,&k2);
        bVar3 = std::operator==(&local_910,"type");
        std::__cxx11::string::~string((string *)&local_910);
        if (bVar3) {
          std::__cxx11::string::assign((char *)&v2);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_910,"NamedMeasurement",(allocator<char> *)&local_8b0);
        cmXMLWriter::StartElement(xml,&local_910);
        std::__cxx11::string::~string((string *)&local_910);
        cmXMLWriter::Attribute<std::__cxx11::string>(xml,_ifs,(string *)&ostr);
        cmXMLWriter::Attribute<std::__cxx11::string>(xml,k2._M_dataplus._M_p,&v2);
        cmXMLWriter::Attribute<char[5]>(xml,"encoding",(char (*) [5])0x45804a);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_910,"Value",&local_989);
        std::operator+(&local_8d0,"Image ",&local_940);
        std::operator+(&local_8b0,&local_8d0," is empty");
        cmXMLWriter::Element<std::__cxx11::string>(xml,&local_910,&local_8b0);
        std::__cxx11::string::~string((string *)&local_8b0);
        std::__cxx11::string::~string((string *)&local_8d0);
        std::__cxx11::string::~string((string *)&local_910);
        cmXMLWriter::EndElement(xml);
        std::__cxx11::string::~string((string *)&v2);
        std::__cxx11::string::~string((string *)&k2);
        std::__cxx11::string::~string((string *)&ostr);
        std::__cxx11::string::~string((string *)&ifs);
      }
      else {
        std::ifstream::ifstream((string *)&ifs,local_940._M_dataplus._M_p,_S_in);
        input = (uchar *)operator_new__(length + 1);
        std::istream::read((char *)&ifs,(long)input);
        output = (uchar *)operator_new__((long)(int)((double)(long)length * 1.5 + 5.0));
        sVar4 = cmsysBase64_Encode(input,length,output,1);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&ostr,"NamedMeasurement",(allocator<char> *)&k2);
        cmXMLWriter::StartElement(xml,(string *)&ostr);
        std::__cxx11::string::~string((string *)&ostr);
        cmsys::RegularExpressionMatch::match_abi_cxx11_((string *)&ostr,&measurementfile.regmatch,1)
        ;
        _Var2._M_p = _ostr;
        cmsys::RegularExpressionMatch::match_abi_cxx11_(&k2,&measurementfile.regmatch,2);
        cmXMLWriter::Attribute<std::__cxx11::string>(xml,_Var2._M_p,&k2);
        std::__cxx11::string::~string((string *)&k2);
        std::__cxx11::string::~string((string *)&ostr);
        cmsys::RegularExpressionMatch::match_abi_cxx11_((string *)&ostr,&measurementfile.regmatch,3)
        ;
        _Var2._M_p = _ostr;
        cmsys::RegularExpressionMatch::match_abi_cxx11_(&k2,&measurementfile.regmatch,4);
        cmXMLWriter::Attribute<std::__cxx11::string>(xml,_Var2._M_p,&k2);
        std::__cxx11::string::~string((string *)&k2);
        std::__cxx11::string::~string((string *)&ostr);
        cmXMLWriter::Attribute<char[7]>(xml,"encoding",(char (*) [7])"base64");
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ostr);
        for (uVar6 = 0; sVar4 != uVar6; uVar6 = uVar6 + 1) {
          std::operator<<((ostream *)&ostr,output[uVar6]);
          if ((uVar6 != 0) && ((uVar6 / 0x3c) * 0x3c - uVar6 == 0)) {
            std::endl<char,std::char_traits<char>>((ostream *)&ostr);
          }
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&k2,"Value",(allocator<char> *)&local_910);
        std::__cxx11::stringbuf::str();
        xml = local_920;
        cmXMLWriter::Element<std::__cxx11::string>(local_920,&k2,&v2);
        std::__cxx11::string::~string((string *)&v2);
        std::__cxx11::string::~string((string *)&k2);
        cmXMLWriter::EndElement(xml);
        operator_delete__(input);
        operator_delete__(output);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ostr);
        std::ifstream::~ifstream((string *)&ifs);
      }
    }
    else {
      cmsys::RegularExpressionMatch::match_abi_cxx11_((string *)&ifs,&measurementfile.regmatch,1);
      bVar3 = std::operator==((string *)&ifs,"name");
      std::__cxx11::string::~string((string *)&ifs);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ifs,"NamedMeasurement",(allocator<char> *)&ostr);
      cmXMLWriter::StartElement(xml,(string *)&ifs);
      std::__cxx11::string::~string((string *)&ifs);
      cmsys::RegularExpressionMatch::match_abi_cxx11_
                ((string *)&ifs,&measurementfile.regmatch,(uint)!bVar3 * 2 + 2);
      cmXMLWriter::Attribute<std::__cxx11::string>(xml,"name",(string *)&ifs);
      std::__cxx11::string::~string((string *)&ifs);
      cmXMLWriter::Attribute<char[12]>(xml,"text",(char (*) [12])"text/string");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ifs,"Value",(allocator<char> *)&v2);
      std::operator+(&k2,"File ",&local_940);
      std::operator+((string *)&ostr,&k2," not found");
      cmXMLWriter::Element<std::__cxx11::string>(xml,(string *)&ifs,(string *)&ostr);
      std::__cxx11::string::~string((string *)&ostr);
      std::__cxx11::string::~string((string *)&k2);
      std::__cxx11::string::~string((string *)&ifs);
      cmXMLWriter::EndElement(xml);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
      poVar5 = std::operator<<((ostream *)&ifs,"File \"");
      poVar5 = std::operator<<(poVar5,(string *)&local_940);
      poVar5 = std::operator<<(poVar5,"\" not found.");
      std::endl<char,std::char_traits<char>>(poVar5);
      pcVar1 = local_918;
      this_00 = (local_918->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(this_00,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                   ,0x7fe,_ostr,(pcVar1->super_cmCTestGenericHandler).Quiet);
      std::__cxx11::string::~string((string *)&ostr);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
    }
    std::__cxx11::string::erase
              ((ulong)&cxml,
               (long)measurementfile.regmatch.startp[0] -
               (long)measurementfile.regmatch.searchstring);
    std::__cxx11::string::~string((string *)&local_940);
  } while( true );
}

Assistant:

void cmCTestTestHandler::GenerateRegressionImages(cmXMLWriter& xml,
                                                  const std::string& dart)
{
  cmsys::RegularExpression twoattributes(
    "<DartMeasurement" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*>([^<]*)</DartMeasurement>");
  cmsys::RegularExpression threeattributes(
    "<DartMeasurement" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*>([^<]*)</DartMeasurement>");
  cmsys::RegularExpression fourattributes(
    "<DartMeasurement" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*>([^<]*)</DartMeasurement>");
  cmsys::RegularExpression cdatastart(
    "<DartMeasurement" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*>" SPACE_REGEX "*<!\\[CDATA\\[");
  cmsys::RegularExpression cdataend("]]>" SPACE_REGEX "*</DartMeasurement>");
  cmsys::RegularExpression measurementfile(
    "<DartMeasurementFile" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*>([^<]*)</DartMeasurementFile>");

  bool done = false;
  std::string cxml = dart;
  while (!done) {
    if (twoattributes.find(cxml)) {
      xml.StartElement("NamedMeasurement");
      xml.Attribute(twoattributes.match(1).c_str(), twoattributes.match(2));
      xml.Attribute(twoattributes.match(3).c_str(), twoattributes.match(4));
      xml.Element("Value", twoattributes.match(5));
      xml.EndElement();
      cxml.erase(twoattributes.start(),
                 twoattributes.end() - twoattributes.start());
    } else if (threeattributes.find(cxml)) {
      xml.StartElement("NamedMeasurement");
      xml.Attribute(threeattributes.match(1).c_str(),
                    threeattributes.match(2));
      xml.Attribute(threeattributes.match(3).c_str(),
                    threeattributes.match(4));
      xml.Attribute(threeattributes.match(5).c_str(),
                    threeattributes.match(6));
      xml.Element("Value", twoattributes.match(7));
      xml.EndElement();
      cxml.erase(threeattributes.start(),
                 threeattributes.end() - threeattributes.start());
    } else if (fourattributes.find(cxml)) {
      xml.StartElement("NamedMeasurement");
      xml.Attribute(fourattributes.match(1).c_str(), fourattributes.match(2));
      xml.Attribute(fourattributes.match(3).c_str(), fourattributes.match(4));
      xml.Attribute(fourattributes.match(5).c_str(), fourattributes.match(6));
      xml.Attribute(fourattributes.match(7).c_str(), fourattributes.match(8));
      xml.Element("Value", twoattributes.match(9));
      xml.EndElement();
      cxml.erase(fourattributes.start(),
                 fourattributes.end() - fourattributes.start());
    } else if (cdatastart.find(cxml) && cdataend.find(cxml)) {
      xml.StartElement("NamedMeasurement");
      xml.Attribute(cdatastart.match(1).c_str(), cdatastart.match(2));
      xml.Attribute(cdatastart.match(3).c_str(), cdatastart.match(4));
      xml.StartElement("Value");
      xml.CData(
        cxml.substr(cdatastart.end(), cdataend.start() - cdatastart.end()));
      xml.EndElement(); // Value
      xml.EndElement(); // NamedMeasurement
      cxml.erase(cdatastart.start(), cdataend.end() - cdatastart.start());
    } else if (measurementfile.find(cxml)) {
      const std::string& filename =
        cmCTest::CleanString(measurementfile.match(5));
      if (cmSystemTools::FileExists(filename)) {
        long len = cmSystemTools::FileLength(filename);
        if (len == 0) {
          std::string k1 = measurementfile.match(1);
          std::string v1 = measurementfile.match(2);
          std::string k2 = measurementfile.match(3);
          std::string v2 = measurementfile.match(4);
          if (cmSystemTools::LowerCase(k1) == "type") {
            v1 = "text/string";
          }
          if (cmSystemTools::LowerCase(k2) == "type") {
            v2 = "text/string";
          }

          xml.StartElement("NamedMeasurement");
          xml.Attribute(k1.c_str(), v1);
          xml.Attribute(k2.c_str(), v2);
          xml.Attribute("encoding", "none");
          xml.Element("Value", "Image " + filename + " is empty");
          xml.EndElement();
        } else {
          cmsys::ifstream ifs(filename.c_str(),
                              std::ios::in
#ifdef _WIN32
                                | std::ios::binary
#endif
          );
          unsigned char* file_buffer = new unsigned char[len + 1];
          ifs.read(reinterpret_cast<char*>(file_buffer), len);
          unsigned char* encoded_buffer = new unsigned char[static_cast<int>(
            static_cast<double>(len) * 1.5 + 5.0)];

          size_t rlen =
            cmsysBase64_Encode(file_buffer, len, encoded_buffer, 1);

          xml.StartElement("NamedMeasurement");
          xml.Attribute(measurementfile.match(1).c_str(),
                        measurementfile.match(2));
          xml.Attribute(measurementfile.match(3).c_str(),
                        measurementfile.match(4));
          xml.Attribute("encoding", "base64");
          std::ostringstream ostr;
          for (size_t cc = 0; cc < rlen; cc++) {
            ostr << encoded_buffer[cc];
            if (cc % 60 == 0 && cc) {
              ostr << std::endl;
            }
          }
          xml.Element("Value", ostr.str());
          xml.EndElement(); // NamedMeasurement
          delete[] file_buffer;
          delete[] encoded_buffer;
        }
      } else {
        int idx = 4;
        if (measurementfile.match(1) == "name") {
          idx = 2;
        }
        xml.StartElement("NamedMeasurement");
        xml.Attribute("name", measurementfile.match(idx));
        xml.Attribute("text", "text/string");
        xml.Element("Value", "File " + filename + " not found");
        xml.EndElement();
        cmCTestOptionalLog(
          this->CTest, HANDLER_OUTPUT,
          "File \"" << filename << "\" not found." << std::endl, this->Quiet);
      }
      cxml.erase(measurementfile.start(),
                 measurementfile.end() - measurementfile.start());
    } else {
      done = true;
    }
  }
}